

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_bitops(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int lsb,int msb)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  uint local_20;
  int msb_local;
  int lsb_local;
  int rs_local;
  int rt_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx_00);
  t_00 = tcg_temp_new_i64(tcg_ctx_00);
  gen_load_gpr(tcg_ctx_00,t_00,rs);
  tcg_ctx._4_4_ = msb;
  local_20 = lsb;
  switch(opc) {
  case 0x7c000000:
    if (0x1f < lsb + msb) goto LAB_00d0b80c;
    if (msb == 0x1f) {
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,t,t_00);
    }
    else {
      tcg_gen_extract_i64_mips64el(tcg_ctx_00,t,t_00,lsb,msb + 1);
    }
    goto LAB_00d0b836;
  case 0x7c000001:
    tcg_ctx._4_4_ = msb + 0x20;
    break;
  case 0x7c000002:
    local_20 = lsb + 0x20;
    break;
  case 0x7c000003:
    break;
  case 0x7c000004:
    if (lsb <= msb) {
      gen_load_gpr(tcg_ctx_00,t,rt);
      tcg_gen_deposit_i64_mips64el(tcg_ctx_00,t,t,t_00,lsb,(msb - lsb) + 1);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,t,t);
      goto LAB_00d0b836;
    }
    goto LAB_00d0b80c;
  case 0x7c000005:
    goto switchD_00d0b6c6_caseD_7c000005;
  case 0x7c000006:
    local_20 = lsb + 0x20;
switchD_00d0b6c6_caseD_7c000005:
    tcg_ctx._4_4_ = msb + 0x20;
switchD_00d0b6c6_caseD_7c000007:
    if (tcg_ctx._4_4_ < (int)local_20) goto LAB_00d0b80c;
    gen_load_gpr(tcg_ctx_00,t,rt);
    tcg_gen_deposit_i64_mips64el(tcg_ctx_00,t,t,t_00,local_20,(tcg_ctx._4_4_ - local_20) + 1);
    goto LAB_00d0b836;
  case 0x7c000007:
    goto switchD_00d0b6c6_caseD_7c000007;
  default:
    goto LAB_00d0b80c;
  }
  if ((int)(local_20 + tcg_ctx._4_4_) < 0x40) {
    tcg_gen_extract_i64_mips64el(tcg_ctx_00,t,t_00,local_20,tcg_ctx._4_4_ + 1);
LAB_00d0b836:
    gen_store_gpr(tcg_ctx_00,t,rt);
    tcg_temp_free_i64(tcg_ctx_00,t);
    tcg_temp_free_i64(tcg_ctx_00,t_00);
  }
  else {
LAB_00d0b80c:
    generate_exception_end(ctx,0x14);
    tcg_temp_free_i64(tcg_ctx_00,t);
    tcg_temp_free_i64(tcg_ctx_00,t_00);
  }
  return;
}

Assistant:

static void gen_bitops(DisasContext *ctx, uint32_t opc, int rt,
                       int rs, int lsb, int msb)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t1, rs);
    switch (opc) {
    case OPC_EXT:
        if (lsb + msb > 31) {
            goto fail;
        }
        if (msb != 31) {
            tcg_gen_extract_tl(tcg_ctx, t0, t1, lsb, msb + 1);
        } else {
            /*
             * The two checks together imply that lsb == 0,
             * so this is a simple sign-extension.
             */
            tcg_gen_ext32s_tl(tcg_ctx, t0, t1);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DEXTU:
        lsb += 32;
        goto do_dext;
    case OPC_DEXTM:
        msb += 32;
        goto do_dext;
    case OPC_DEXT:
    do_dext:
        if (lsb + msb > 63) {
            goto fail;
        }
        tcg_gen_extract_tl(tcg_ctx, t0, t1, lsb, msb + 1);
        break;
#endif
    case OPC_INS:
        if (lsb > msb) {
            goto fail;
        }
        gen_load_gpr(tcg_ctx, t0, rt);
        tcg_gen_deposit_tl(tcg_ctx, t0, t0, t1, lsb, msb - lsb + 1);
        tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DINSU:
        lsb += 32;
        /* FALLTHRU */
    case OPC_DINSM:
        msb += 32;
        /* FALLTHRU */
    case OPC_DINS:
        if (lsb > msb) {
            goto fail;
        }
        gen_load_gpr(tcg_ctx, t0, rt);
        tcg_gen_deposit_tl(tcg_ctx, t0, t0, t1, lsb, msb - lsb + 1);
        break;
#endif
    default:
fail:
        MIPS_INVAL("bitops");
        generate_exception_end(ctx, EXCP_RI);
        tcg_temp_free(tcg_ctx, t0);
        tcg_temp_free(tcg_ctx, t1);
        return;
    }
    gen_store_gpr(tcg_ctx, t0, rt);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}